

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O2

wchar_t assertion_assert(char *file,wchar_t line,wchar_t value,char *condition,void *extra)

{
  assertions = assertions + L'\x01';
  msg = nextmsg;
  nextmsg = (char *)0x0;
  if (value == L'\0') {
    failure_start(file,line,"Assertion failed: %s");
    failure_finish(file);
  }
  return value;
}

Assistant:

int
assertion_assert(const char *file, int line, int value,
    const char *condition, void *extra)
{
	assertion_count(file, line);
	if (!value) {
		failure_start(file, line, "Assertion failed: %s", condition);
		failure_finish(extra);
	}
	return (value);
}